

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::setSolution(Highs *this,HighsInt num_entries,HighsInt *index,double *value)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  char *pcVar4;
  reference rVar5;
  reference rVar6;
  HighsInt iCol_1;
  HighsInt iX_1;
  HighsSolution new_solution;
  HighsInt iCol;
  HighsInt iX;
  vector<bool,_std::allocator<bool>_> is_set;
  HighsInt num_duplicates;
  HighsStatus return_status;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  HighsSolution *in_stack_fffffffffffffe00;
  HighsSolution *this_00;
  _Bit_type in_stack_fffffffffffffe18;
  _Bit_type *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe48;
  HighsLogOptions *log_options_;
  HighsLogOptions *in_stack_fffffffffffffe50;
  value_type vVar7;
  HighsSolution local_189;
  int local_108;
  int local_104;
  vector<double,_std::allocator<double>_> local_f8 [4];
  reference local_98;
  reference local_88;
  undefined4 local_78;
  uint local_74;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff94;
  Highs *in_stack_ffffffffffffff98;
  uint local_30;
  HighsStatus local_4;
  
  local_30 = 0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x490ebb);
  std::vector<bool,_std::allocator<bool>_>::assign
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe00,
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),(bool *)0x490ee1);
  rVar6._M_mask = in_stack_fffffffffffffe18;
  rVar6._M_p = in_stack_fffffffffffffe20;
  uVar8 = 0;
  do {
    if (in_ESI <= (int)uVar8) {
      if (0 < (int)local_30) {
        pcVar4 = "";
        if (1 < (int)local_30) {
          pcVar4 = "s";
        }
        highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kWarning,
                     "setSolution: User set of indices has %d duplicate%s: last value used\n",
                     (ulong)local_30,pcVar4);
      }
      HighsSolution::HighsSolution(in_stack_fffffffffffffe00);
      std::vector<double,_std::allocator<double>_>::assign
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00,
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 (value_type_conflict1 *)0x491249);
      for (local_104 = 0; local_104 < in_ESI; local_104 = local_104 + 1) {
        local_108 = *(int *)(in_RDX + (long)local_104 * 4);
        vVar7 = *(value_type *)(in_RCX + (long)local_104 * 8);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_f8,(long)local_108);
        *pvVar3 = vVar7;
      }
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)in_stack_fffffffffffffe00,
                 (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      setSolution(in_stack_ffffffffffffff98,
                  (HighsSolution *)CONCAT44(in_stack_ffffffffffffff94,uVar8));
      this_00 = &local_189;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_189.dual_valid,"setSolution",(allocator *)this_00);
      local_4 = interpretCallStatus(in_stack_fffffffffffffe50,
                                    (HighsStatus)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                                    (HighsStatus)in_stack_fffffffffffffe48,
                                    (string *)
                                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      std::__cxx11::string::~string((string *)&local_189.dual_valid);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4913a6);
      local_78 = 1;
      HighsSolution::~HighsSolution(this_00);
LAB_00491433:
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x491440);
      return local_4;
    }
    local_74 = *(uint *)(in_RDX + (long)(int)uVar8 * 4);
    if (((int)local_74 < 0) || (*(int *)(in_RDI + 0x138) < (int)local_74)) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "setSolution: User solution index %d has value %d out of range [0, %d)",
                   (ulong)uVar8,(ulong)local_74,(ulong)*(uint *)(in_RDI + 0x138));
      local_4 = kError;
      local_78 = 1;
      goto LAB_00491433;
    }
    dVar1 = *(double *)(in_RCX + (long)(int)uVar8 * 8);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x158),
                        (long)(int)local_74);
    if (dVar1 < *pvVar3 - *(double *)(in_RDI + 0xbc0)) {
LAB_00491050:
      log_options_ = *(HighsLogOptions **)(in_RCX + (long)(int)uVar8 * 8);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x158),
                          (long)(int)local_74);
      vVar7 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x170),
                          (long)(int)local_74);
      highsLogUser(log_options_,(HighsLogType)vVar7,(char *)*pvVar3,in_RDI + 0xe28,5,
                   "setSolution: User solution value %d of %g is infeasible for bounds [%g, %g]",
                   (ulong)uVar8);
      local_4 = kError;
      local_78 = 1;
      goto LAB_00491433;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x170),
                        (long)(int)local_74);
    if (*pvVar3 + *(double *)(in_RDI + 0xbc0) < *(double *)(in_RCX + (long)(int)uVar8 * 8))
    goto LAB_00491050;
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)rVar6._M_p,rVar6._M_mask);
    local_88 = rVar5;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_88);
    if (bVar2) {
      local_30 = local_30 + 1;
    }
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)rVar6._M_p,rVar6._M_mask);
    local_98 = rVar6;
    std::_Bit_reference::operator=(&local_98,true);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

HighsStatus Highs::setSolution(const HighsInt num_entries,
                               const HighsInt* index, const double* value) {
  HighsStatus return_status = HighsStatus::kOk;
  // Warn about duplicates in index
  HighsInt num_duplicates = 0;
  std::vector<bool> is_set;
  is_set.assign(model_.lp_.num_col_, false);
  for (HighsInt iX = 0; iX < num_entries; iX++) {
    HighsInt iCol = index[iX];
    if (iCol < 0 || iCol > model_.lp_.num_col_) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "setSolution: User solution index %d has value %d out of "
                   "range [0, %d)",
                   int(iX), int(iCol), int(model_.lp_.num_col_));
      return HighsStatus::kError;
    } else if (value[iX] < model_.lp_.col_lower_[iCol] -
                               options_.primal_feasibility_tolerance ||
               model_.lp_.col_upper_[iCol] +
                       options_.primal_feasibility_tolerance <
                   value[iX]) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "setSolution: User solution value %d of %g is infeasible "
                   "for bounds [%g, %g]",
                   int(iX), value[iX], model_.lp_.col_lower_[iCol],
                   model_.lp_.col_upper_[iCol]);
      return HighsStatus::kError;
    }
    if (is_set[iCol]) num_duplicates++;
    is_set[iCol] = true;
  }
  if (num_duplicates > 0) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "setSolution: User set of indices has %d duplicate%s: last "
                 "value used\n",
                 int(num_duplicates), num_duplicates > 1 ? "s" : "");
    return_status = HighsStatus::kWarning;
  }

  // Clear the solution, indicate the values not determined by the
  // user, and insert the values determined by the user
  HighsSolution new_solution;
  new_solution.col_value.assign(model_.lp_.num_col_, kHighsUndefined);
  for (HighsInt iX = 0; iX < num_entries; iX++) {
    HighsInt iCol = index[iX];
    new_solution.col_value[iCol] = value[iX];
  }
  return interpretCallStatus(options_.log_options, setSolution(new_solution),
                             return_status, "setSolution");
}